

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextWrappedV(char *fmt,__va_list_tag *args)

{
  float *pfVar1;
  bool bVar2;
  uint *in_RSI;
  char *in_RDI;
  bool need_backup;
  ImGuiContext *g;
  ImGuiTextFlags in_stack_000000f4;
  char *in_stack_000000f8;
  char *in_stack_00000100;
  undefined8 in_stack_ffffffffffffffd0;
  __va_list_tag *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar3;
  
  pfVar1 = &(GImGui->CurrentWindow->DC).TextWrapPos;
  bVar2 = *pfVar1 <= 0.0 && *pfVar1 != 0.0;
  uVar3 = CONCAT13(bVar2,in_stack_ffffffffffffffe4);
  if (bVar2) {
    PushTextWrapPos((float)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  }
  if (((*in_RDI == '%') && (in_RDI[1] == 's')) && (in_RDI[2] == '\0')) {
    if (*in_RSI < 0x29) {
      *in_RSI = *in_RSI + 8;
    }
    else {
      *(long *)(in_RSI + 2) = *(long *)(in_RSI + 2) + 8;
    }
    TextEx(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  }
  else {
    TextV((char *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  }
  if ((uVar3 & 0x1000000) != 0) {
    PopTextWrapPos();
  }
  return;
}

Assistant:

void ImGui::TextWrappedV(const char* fmt, va_list args)
{
    ImGuiContext& g = *GImGui;
    bool need_backup = (g.CurrentWindow->DC.TextWrapPos < 0.0f);  // Keep existing wrap position if one is already set
    if (need_backup)
        PushTextWrapPos(0.0f);
    if (fmt[0] == '%' && fmt[1] == 's' && fmt[2] == 0)
        TextEx(va_arg(args, const char*), NULL, ImGuiTextFlags_NoWidthForLargeClippedText); // Skip formatting
    else
        TextV(fmt, args);
    if (need_backup)
        PopTextWrapPos();
}